

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O2

void ImGui_ImplGlfw_NewFrame(void)

{
  int iVar1;
  ImGuiMouseCursor IVar2;
  ImGuiIO *pIVar3;
  ImGui_ImplGlfw_Data *pIVar4;
  GLFWcursor *cursorHandle;
  float fVar5;
  ImVec2 IVar6;
  double dVar7;
  ImVec2 IVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double mouse_x;
  int display_h;
  int display_w;
  int h;
  int w;
  GLFWgamepadstate local_60;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  double local_28;
  
  pIVar3 = ImGui::GetIO();
  pIVar4 = ImGui_ImplGlfw_GetBackendData();
  glfwGetWindowSize(pIVar4->Window,&local_2c,&local_30);
  glfwGetFramebufferSize(pIVar4->Window,&local_34,&local_38);
  IVar6.x = (float)local_2c;
  IVar6.y = (float)local_30;
  auVar11._8_8_ = 0;
  auVar11._0_4_ = IVar6.x;
  auVar11._4_4_ = IVar6.y;
  pIVar3->DisplaySize = IVar6;
  if (0 < local_30 && 0 < local_2c) {
    auVar10._0_4_ = (float)local_34;
    auVar10._4_4_ = (float)local_38;
    auVar10._8_8_ = 0;
    auVar11 = divps(auVar10,auVar11);
    pIVar3->DisplayFramebufferScale = auVar11._0_8_;
  }
  dVar7 = glfwGetTime();
  if (0.0 < pIVar4->Time) {
    fVar9 = (float)(dVar7 - pIVar4->Time);
  }
  else {
    fVar9 = 0.016666668;
  }
  pIVar3->DeltaTime = fVar9;
  pIVar4->Time = dVar7;
  pIVar4 = ImGui_ImplGlfw_GetBackendData();
  pIVar3 = ImGui::GetIO();
  iVar1 = glfwGetInputMode(pIVar4->Window,0x33001);
  if (iVar1 == 0x34003) {
    ImGuiIO::AddMousePosEvent(pIVar3,-3.4028235e+38,-3.4028235e+38);
  }
  else {
    iVar1 = glfwGetWindowAttrib(pIVar4->Window,0x20001);
    if (iVar1 != 0) {
      if (pIVar3->WantSetMousePos == true) {
        glfwSetCursorPos(pIVar4->Window,(double)(pIVar3->MousePos).x,(double)(pIVar3->MousePos).y);
      }
      if (pIVar4->MouseWindow == (GLFWwindow *)0x0) {
        glfwGetCursorPos(pIVar4->Window,(double *)&local_60,&local_28);
        ImGuiIO::AddMousePosEvent
                  (pIVar3,(float)(double)CONCAT17(local_60.buttons[7],
                                                  CONCAT16(local_60.buttons[6],
                                                           CONCAT15(local_60.buttons[5],
                                                                    CONCAT14(local_60.buttons[4],
                                                                             CONCAT13(local_60.
                                                  buttons[3],
                                                  CONCAT12(local_60.buttons[2],
                                                           CONCAT11(local_60.buttons[1],
                                                                    local_60.buttons[0]))))))),
                   (float)local_28);
        IVar8.x = (float)(double)CONCAT17(local_60.buttons[7],
                                          CONCAT16(local_60.buttons[6],
                                                   CONCAT15(local_60.buttons[5],
                                                            CONCAT14(local_60.buttons[4],
                                                                     CONCAT13(local_60.buttons[3],
                                                                              CONCAT12(local_60.
                                                  buttons[2],
                                                  CONCAT11(local_60.buttons[1],local_60.buttons[0]))
                                                  )))));
        IVar8.y = (float)local_28;
        pIVar4->LastValidMousePos = IVar8;
      }
    }
  }
  pIVar3 = ImGui::GetIO();
  pIVar4 = ImGui_ImplGlfw_GetBackendData();
  if ((pIVar3->ConfigFlags & 0x20) == 0) {
    iVar1 = glfwGetInputMode(pIVar4->Window,0x33001);
    if (iVar1 != 0x34003) {
      IVar2 = ImGui::GetMouseCursor();
      iVar1 = 0x34002;
      if ((IVar2 != -1) && (pIVar3->MouseDrawCursor == false)) {
        cursorHandle = pIVar4->MouseCursors[IVar2];
        if (cursorHandle == (GLFWcursor *)0x0) {
          cursorHandle = pIVar4->MouseCursors[0];
        }
        glfwSetCursor(pIVar4->Window,cursorHandle);
        iVar1 = 0x34001;
      }
      glfwSetInputMode(pIVar4->Window,0x33001,iVar1);
    }
  }
  pIVar3 = ImGui::GetIO();
  if ((pIVar3->ConfigFlags & 2) != 0) {
    *(byte *)&pIVar3->BackendFlags = (byte)pIVar3->BackendFlags & 0xfe;
    iVar1 = glfwGetGamepadState(0,&local_60);
    if (iVar1 != 0) {
      *(byte *)&pIVar3->BackendFlags = (byte)pIVar3->BackendFlags | 1;
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadStart,local_60.buttons[7] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadBack,local_60.buttons[6] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadFaceLeft,local_60.buttons[2] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadFaceRight,local_60.buttons[1] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadFaceUp,local_60.buttons[3] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadFaceDown,local_60.buttons[0] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadDpadLeft,local_60.buttons[0xe] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadDpadRight,local_60.buttons[0xc] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadDpadUp,local_60.buttons[0xb] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadDpadDown,local_60.buttons[0xd] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadL1,local_60.buttons[4] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadR1,local_60.buttons[5] != '\0');
      fVar5 = (local_60.axes[4] + 0.75) / 1.75;
      fVar9 = 1.0;
      if (fVar5 <= 1.0) {
        fVar9 = fVar5;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadL2,0.1 < fVar5,(float)(~-(uint)(fVar5 < 0.0) & (uint)fVar9))
      ;
      fVar5 = (local_60.axes[5] + 0.75) / 1.75;
      fVar9 = 1.0;
      if (fVar5 <= 1.0) {
        fVar9 = fVar5;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadR2,0.1 < fVar5,(float)(~-(uint)(fVar5 < 0.0) & (uint)fVar9))
      ;
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadL3,local_60.buttons[9] != '\0');
      ImGuiIO::AddKeyEvent(pIVar3,ImGuiKey_GamepadR3,local_60.buttons[10] != '\0');
      fVar5 = (local_60.axes[0] + 0.25) / -0.75;
      fVar9 = 1.0;
      if (fVar5 <= 1.0) {
        fVar9 = fVar5;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadLStickLeft,0.1 < fVar5,
                 (float)(~-(uint)(fVar5 < 0.0) & (uint)fVar9));
      fVar5 = (local_60.axes[0] + -0.25) / 0.75;
      fVar9 = 1.0;
      if (fVar5 <= 1.0) {
        fVar9 = fVar5;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadLStickRight,0.1 < fVar5,
                 (float)(~-(uint)(fVar5 < 0.0) & (uint)fVar9));
      fVar5 = (local_60.axes[1] + 0.25) / -0.75;
      fVar9 = 1.0;
      if (fVar5 <= 1.0) {
        fVar9 = fVar5;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadLStickUp,0.1 < fVar5,
                 (float)(~-(uint)(fVar5 < 0.0) & (uint)fVar9));
      fVar5 = (local_60.axes[1] + -0.25) / 0.75;
      fVar9 = 1.0;
      if (fVar5 <= 1.0) {
        fVar9 = fVar5;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadLStickDown,0.1 < fVar5,
                 (float)(~-(uint)(fVar5 < 0.0) & (uint)fVar9));
      fVar5 = (local_60.axes[2] + 0.25) / -0.75;
      fVar9 = 1.0;
      if (fVar5 <= 1.0) {
        fVar9 = fVar5;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadRStickLeft,0.1 < fVar5,
                 (float)(~-(uint)(fVar5 < 0.0) & (uint)fVar9));
      fVar5 = (local_60.axes[2] + -0.25) / 0.75;
      fVar9 = 1.0;
      if (fVar5 <= 1.0) {
        fVar9 = fVar5;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadRStickRight,0.1 < fVar5,
                 (float)(~-(uint)(fVar5 < 0.0) & (uint)fVar9));
      fVar5 = (local_60.axes[3] + 0.25) / -0.75;
      fVar9 = 1.0;
      if (fVar5 <= 1.0) {
        fVar9 = fVar5;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadRStickUp,0.1 < fVar5,
                 (float)(~-(uint)(fVar5 < 0.0) & (uint)fVar9));
      fVar5 = (local_60.axes[3] + -0.25) / 0.75;
      fVar9 = 1.0;
      if (fVar5 <= 1.0) {
        fVar9 = fVar5;
      }
      ImGuiIO::AddKeyAnalogEvent
                (pIVar3,ImGuiKey_GamepadRStickDown,0.1 < fVar5,
                 (float)(~-(uint)(fVar5 < 0.0) & (uint)fVar9));
    }
  }
  return;
}

Assistant:

void ImGui_ImplGlfw_NewFrame()
{
    ImGuiIO& io = ImGui::GetIO();
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    IM_ASSERT(bd != nullptr && "Did you call ImGui_ImplGlfw_InitForXXX()?");

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    glfwGetWindowSize(bd->Window, &w, &h);
    glfwGetFramebufferSize(bd->Window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    if (w > 0 && h > 0)
        io.DisplayFramebufferScale = ImVec2((float)display_w / (float)w, (float)display_h / (float)h);

    // Setup time step
    double current_time = glfwGetTime();
    io.DeltaTime = bd->Time > 0.0 ? (float)(current_time - bd->Time) : (float)(1.0f / 60.0f);
    bd->Time = current_time;

    ImGui_ImplGlfw_UpdateMouseData();
    ImGui_ImplGlfw_UpdateMouseCursor();

    // Update game controllers (if enabled and available)
    ImGui_ImplGlfw_UpdateGamepads();
}